

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O0

Vec_Int_t *
Gia_PolynCoreOrder_int
          (Gia_Man_t *pGia,Vec_Int_t *vAdds,Vec_Wec_t *vMap,Vec_Int_t *vRoots,Vec_Int_t **pvIns)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Bit_t *p_00;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vLevel;
  int Entry2;
  int Entry1;
  int Driver;
  int Index;
  int k;
  int i;
  Vec_Bit_t *vIsRoot;
  Vec_Int_t *vOrder;
  Vec_Int_t **pvIns_local;
  Vec_Int_t *vRoots_local;
  Vec_Wec_t *vMap_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *pGia_local;
  
  p = Vec_IntAlloc(1000);
  iVar1 = Gia_ManObjNum(pGia);
  p_00 = Vec_BitStart(iVar1);
  Entry1 = -1;
  vLevel._0_4_ = -1;
  for (Index = 0; iVar1 = Vec_IntSize(vRoots), Index < iVar1; Index = Index + 1) {
    iVar1 = Vec_IntEntry(vRoots,Index);
    Vec_BitWriteEntry(p_00,iVar1,1);
  }
  do {
    for (Index = 0; iVar1 = Vec_IntSize(vRoots), Index < iVar1; Index = Index + 1) {
      iVar1 = Vec_IntEntry(vRoots,Index);
      pVVar3 = Vec_WecEntry(vMap,iVar1);
      for (Driver = 0; iVar2 = Vec_IntSize(pVVar3), Driver + 1 < iVar2; Driver = Driver + 2) {
        Entry1 = Vec_IntEntry(pVVar3,Driver);
        vLevel._0_4_ = Vec_IntEntry(pVVar3,Driver + 1);
        iVar2 = Vec_BitEntry(p_00,(int)vLevel);
        if (iVar2 != 0) break;
      }
      iVar2 = Vec_IntSize(pVVar3);
      if (Driver != iVar2) {
        iVar2 = Vec_BitEntry(p_00,iVar1);
        if (iVar2 == 0) {
          __assert_fail("Vec_BitEntry(vIsRoot, Entry1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                        ,0x80,
                        "Vec_Int_t *Gia_PolynCoreOrder_int(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t **)"
                       );
        }
        iVar2 = Vec_BitEntry(p_00,(int)vLevel);
        if (iVar2 == 0) {
          __assert_fail("Vec_BitEntry(vIsRoot, Entry2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                        ,0x81,
                        "Vec_Int_t *Gia_PolynCoreOrder_int(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t **)"
                       );
        }
        Vec_IntPush(p,Entry1);
        Vec_BitWriteEntry(p_00,iVar1,0);
        Vec_BitWriteEntry(p_00,(int)vLevel,0);
        Vec_IntRemove(vRoots,iVar1);
        Vec_IntRemove(vRoots,(int)vLevel);
        iVar1 = Vec_IntEntry(vAdds,Entry1 * 6);
        vLevel._0_4_ = Vec_IntEntry(vAdds,Entry1 * 6 + 1);
        iVar2 = Vec_IntEntry(vAdds,Entry1 * 6 + 2);
        Vec_BitWriteEntry(p_00,iVar1,1);
        Vec_BitWriteEntry(p_00,(int)vLevel,1);
        Vec_BitWriteEntry(p_00,iVar2,1);
        Vec_IntPushUnique(vRoots,iVar1);
        Vec_IntPushUnique(vRoots,(int)vLevel);
        Vec_IntPushUnique(vRoots,iVar2);
        break;
      }
    }
    iVar1 = Vec_IntSize(vRoots);
    if (Index == iVar1) {
      if (pvIns != (Vec_Int_t **)0x0) {
        iVar1 = Vec_BitSize(p_00);
        pVVar3 = Vec_IntAlloc(iVar1);
        *pvIns = pVVar3;
        for (Index = 1; iVar1 = Vec_BitSize(p_00), Index < iVar1; Index = Index + 1) {
          iVar1 = Vec_BitEntry(p_00,Index);
          if (iVar1 != 0) {
            Vec_IntPush(*pvIns,Index);
          }
        }
      }
      Vec_BitFree(p_00);
      return p;
    }
  } while( true );
}

Assistant:

Vec_Int_t * Gia_PolynCoreOrder_int( Gia_Man_t * pGia, Vec_Int_t * vAdds, Vec_Wec_t * vMap, Vec_Int_t * vRoots, Vec_Int_t ** pvIns )
{
    Vec_Int_t * vOrder  = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, k, Index = -1, Driver, Entry1, Entry2 = -1;
    // mark roots
    Vec_IntForEachEntry( vRoots, Driver, i )
        Vec_BitWriteEntry( vIsRoot, Driver, 1 );
    // collect boxes
    while ( 1 )
    {
        // iterate through boxes driving this one
        Vec_IntForEachEntry( vRoots, Entry1, i )
        {
            Vec_Int_t * vLevel = Vec_WecEntry( vMap, Entry1 );
            Vec_IntForEachEntryDouble( vLevel, Index, Entry2, k )
                if ( Vec_BitEntry(vIsRoot, Entry2) )
                    break;
            if ( k == Vec_IntSize(vLevel) )
                continue;
            assert( Vec_BitEntry(vIsRoot, Entry1) );
            assert( Vec_BitEntry(vIsRoot, Entry2) );
            // collect adder
            Vec_IntPush( vOrder, Index );
            // clean marks
            Vec_BitWriteEntry( vIsRoot, Entry1, 0 );
            Vec_BitWriteEntry( vIsRoot, Entry2, 0 );
            Vec_IntRemove( vRoots, Entry1 );
            Vec_IntRemove( vRoots, Entry2 );
            // set new marks
            Entry1 = Vec_IntEntry( vAdds, 6*Index + 0 );
            Entry2 = Vec_IntEntry( vAdds, 6*Index + 1 );
            Driver = Vec_IntEntry( vAdds, 6*Index + 2 );
            Vec_BitWriteEntry( vIsRoot, Entry1, 1 );
            Vec_BitWriteEntry( vIsRoot, Entry2, 1 );
            Vec_BitWriteEntry( vIsRoot, Driver, 1 );
            Vec_IntPushUnique( vRoots, Entry1 );
            Vec_IntPushUnique( vRoots, Entry2 );
            Vec_IntPushUnique( vRoots, Driver );
            break;
        }
        if ( i == Vec_IntSize(vRoots) )
            break;
    }
    // collect remaining leaves
    if ( pvIns )
    {
        *pvIns = Vec_IntAlloc( Vec_BitSize(vIsRoot) );
        Vec_BitForEachEntryStart( vIsRoot, Driver, i, 1 )
            if ( Driver )
                Vec_IntPush( *pvIns, i );
    }
    Vec_BitFree( vIsRoot );
    return vOrder;
}